

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_hdr_from_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  undefined1 local_d8 [8];
  stbi__context s;
  
  s.img_n = 0;
  s.img_out_n = 0;
  s.io_user_data._0_4_ = 0;
  s.img_buffer = buffer + len;
  s.buffer_start._120_8_ = buffer;
  s.img_buffer_end = buffer;
  iVar1 = stbi__hdr_test((stbi__context *)local_d8);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_memory(stbi_uc const *buffer, int len)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(buffer);
   STBI_NOTUSED(len);
   return 0;
   #endif
}